

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

thread_pool * new_thread_pool(size_t thread_count)

{
  _Bool _Var1;
  int iVar2;
  thread_data *ptVar3;
  thrd_t *ptVar4;
  ulong local_28;
  size_t i;
  thread_pool *thread_pool;
  size_t thread_count_local;
  
  if (thread_count == 0) {
    __assert_fail("thread_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                  ,0x8a,"struct thread_pool *new_thread_pool(size_t)");
  }
  thread_count_local = (size_t)xmalloc(0xd8);
  _Var1 = init_work_queue(&((thread_pool *)thread_count_local)->queue);
  if (_Var1) {
    ptVar3 = (thread_data *)xmalloc(thread_count * 0x18);
    ((thread_pool *)thread_count_local)->thread_data = ptVar3;
    ptVar4 = (thrd_t *)xmalloc(thread_count << 3);
    ((thread_pool *)thread_count_local)->threads = ptVar4;
    ((thread_pool *)thread_count_local)->thread_count = thread_count;
    ((thread_pool *)thread_count_local)->should_stop = false;
    for (local_28 = 0; local_28 < thread_count; local_28 = local_28 + 1) {
      ((thread_pool *)thread_count_local)->thread_data[local_28].thread_pool =
           (thread_pool *)thread_count_local;
      ((thread_pool *)thread_count_local)->thread_data[local_28].queue =
           &((thread_pool *)thread_count_local)->queue;
      ((thread_pool *)thread_count_local)->thread_data[local_28].thread_id = local_28;
      iVar2 = thrd_create(((thread_pool *)thread_count_local)->threads + local_28,thread_pool_worker
                          ,((thread_pool *)thread_count_local)->thread_data + local_28);
      if (iVar2 != 0) {
        ((thread_pool *)thread_count_local)->thread_count = local_28;
        terminate_threads((thread_pool *)thread_count_local);
        free_work_queue(&((thread_pool *)thread_count_local)->queue);
        free(((thread_pool *)thread_count_local)->threads);
        free(((thread_pool *)thread_count_local)->thread_data);
        goto LAB_001136a8;
      }
    }
  }
  else {
LAB_001136a8:
    free((void *)thread_count_local);
    thread_count_local = 0;
  }
  return (thread_pool *)thread_count_local;
}

Assistant:

struct thread_pool* new_thread_pool(size_t thread_count) {
    assert(thread_count > 0);
    struct thread_pool* thread_pool = xmalloc(sizeof(struct thread_pool));
    if (!init_work_queue(&thread_pool->queue))
        goto cleanup_queue;
    thread_pool->thread_data = xmalloc(sizeof(struct thread_data) * thread_count);
    thread_pool->threads = xmalloc(sizeof(thrd_t) * thread_count);
    thread_pool->thread_count = thread_count;
    thread_pool->should_stop = false;
    for (size_t i = 0; i < thread_count; ++i) {
        thread_pool->thread_data[i].thread_pool = thread_pool;
        thread_pool->thread_data[i].queue = &thread_pool->queue;
        thread_pool->thread_data[i].thread_id = i;
        if (thrd_create(thread_pool->threads + i, thread_pool_worker, &thread_pool->thread_data[i]) != thrd_success) {
            thread_pool->thread_count = i;
            goto cleanup_thread;
        }
    }
    return thread_pool;
cleanup_thread:
    terminate_threads(thread_pool);
    free_work_queue(&thread_pool->queue);
    free(thread_pool->threads);
    free(thread_pool->thread_data);
cleanup_queue:
    free(thread_pool);
    return NULL;
}